

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O3

void __thiscall ConvexBuilder::~ConvexBuilder(ConvexBuilder *this)

{
  ChUll *this_00;
  long lVar1;
  
  (this->super_ConvexDecompInterface)._vptr_ConvexDecompInterface =
       (_func_int **)&PTR__ConvexBuilder_00b4c8d0;
  if (0 < (this->mChulls).m_size) {
    lVar1 = 0;
    do {
      this_00 = (ChUll *)(this->mChulls).m_data[lVar1];
      if (this_00 != (ChUll *)0x0) {
        ChUll::~ChUll(this_00);
      }
      operator_delete(this_00,0x28);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->mChulls).m_size);
  }
  cbtAlignedObjectArray<ChUll_*>::~cbtAlignedObjectArray(&this->mChulls);
  return;
}

Assistant:

ConvexBuilder::~ConvexBuilder(void)
{
	int i;
	for (i=0;i<mChulls.size();i++)
	{
		ChUll *cr = mChulls[i];
		delete cr;
	}
}